

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  uVar1 = bottom_top_blob->c;
  uVar8 = bottom_top_blob->h * bottom_top_blob->w;
  if (this->base == -1.0) {
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    uVar4 = 0;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar4;
    }
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar4;
    }
    sVar3 = bottom_top_blob->elemsize;
    for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        fVar10 = logf(this->scale * *(float *)((long)pvVar7 + uVar5 * 4) + this->shift);
        *(float *)((long)pvVar7 + uVar5 * 4) = fVar10;
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
  }
  else {
    fVar10 = logf(this->base);
    pvVar7 = bottom_top_blob->data;
    uVar4 = 0;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar4;
    }
    sVar2 = bottom_top_blob->cstep;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar4;
    }
    sVar3 = bottom_top_blob->elemsize;
    for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        fVar11 = logf(this->scale * *(float *)((long)pvVar7 + uVar5 * 4) + this->shift);
        *(float *)((long)pvVar7 + uVar5 * 4) = fVar11 * (1.0 / fVar10);
      }
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    }
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = logf(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        float log_base_inv = 1.f / logf(base);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = logf(shift + ptr[i] * scale) * log_base_inv;
            }
        }
    }

    return 0;
}